

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

unique_lock<std::recursive_mutex> trompeloeil::get_lock<void>(void)

{
  undefined8 extraout_RDX;
  unique_lock<std::recursive_mutex> *in_RDI;
  unique_lock<std::recursive_mutex> uVar1;
  
  if (get_lock<void>()::mutex == '\0') {
    get_lock<void>();
  }
  in_RDI->_M_device = get_lock<void>::mutex;
  in_RDI->_M_owns = false;
  Catch::clara::std::unique_lock<std::recursive_mutex>::lock(in_RDI);
  in_RDI->_M_owns = true;
  uVar1._8_8_ = extraout_RDX;
  uVar1._M_device = (mutex_type *)in_RDI;
  return uVar1;
}

Assistant:

unique_lock<std::recursive_mutex> get_lock()
  {
    // Ugly hack for lifetime of mutex. The statically allocated
    // recursive_mutex is intentionally leaked, to ensure that the
    // mutex is available and valid even if the last use is from
    // the destructor of a global object in a translation unit
    // without #include <trompeloeil.hpp>

    static aligned_storage_for<std::recursive_mutex> buffer;
    static auto mutex = new (&buffer) std::recursive_mutex;
    return unique_lock<std::recursive_mutex>{*mutex};
  }